

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::autoPartitionPartialsOperations
          (BeagleCPUImpl<float,_1,_0> *this,int *operations,int *partitionOperations,int count,
          int cumulativeScaleIndex)

{
  int iVar1;
  ulong uVar2;
  int j;
  int iVar3;
  int k;
  long lVar4;
  
  for (uVar2 = 0; uVar2 != (uint)(~(count >> 0x1f) & count); uVar2 = uVar2 + 1) {
    for (iVar3 = 0; iVar3 < this->kPartitionCount; iVar3 = iVar3 + 1) {
      for (lVar4 = 0; iVar1 = (int)uVar2, lVar4 != 7; lVar4 = lVar4 + 1) {
        partitionOperations[(this->kPartitionCount * iVar1 + iVar3) * 9 + lVar4] = operations[lVar4]
        ;
      }
      partitionOperations[(long)((this->kPartitionCount * iVar1 + iVar3) * 9) + 7] = iVar3;
      partitionOperations[(long)((this->kPartitionCount * iVar1 + iVar3) * 9) + 8] =
           cumulativeScaleIndex;
    }
    operations = operations + 7;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoPartitionPartialsOperations(const int* operations,
                                                                        int* partitionOperations,
                                                                        int count,
                                                                        int cumulativeScaleIndex) {

    int numOps  = BEAGLE_OP_COUNT;
    int numOpsP = BEAGLE_PARTITION_OP_COUNT;

    for (int i=0; i<count; i++) {
        for (int j=0; j<kPartitionCount; j++) {
            for (int k=0; k<numOps; k++) {
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + k] = operations[i*numOps + k];
            }
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + numOps    ] = j;
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + numOps + 1] = cumulativeScaleIndex;
        }
    }
}